

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

bool __thiscall QFileDialogPrivate::itemAlreadyExists(QFileDialogPrivate *this,QString *fileName)

{
  QWidget *this_00;
  StandardButton SVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialog::tr((QString *)&local_60,"%1 already exists.\nDo you want to replace it?",(char *)0x0,
                  -1);
  QString::arg<QString,_true>((QString *)&local_48,(QString *)&local_60,fileName,0,(QChar)0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QWidget::windowTitle((QString *)&local_60,this_00);
  SVar1 = QMessageBox::warning
                    (this_00,(QString *)&local_60,(QString *)&local_48,(StandardButtons)0x14000,No);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return SVar1 == Yes;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialogPrivate::itemAlreadyExists(const QString &fileName)
{
#if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
    const QString msg = QFileDialog::tr("%1 already exists.\nDo you want to replace it?").arg(fileName);
    using B = QMessageBox;
    const auto res = B::warning(q, q->windowTitle(), msg, B::Yes | B::No, B::No);
    return res == B::Yes;
#endif
    return false;
}